

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void ex_al_eu(BigNum *r1,BigNum *r2,BigNum *gcd,BigNum *a,BigNum *b)

{
  bool bVar1;
  BigNum *pBVar2;
  BigNum local_1f0;
  BigNum local_1d0;
  BigNum local_1b0;
  BigNum local_190;
  BigNum local_170;
  BigNum local_150;
  BigNum local_130;
  BigNum local_110;
  BigNum local_f0;
  BigNum local_d0;
  BigNum local_b0;
  BigNum local_90;
  BigNum local_70;
  BigNum local_50;
  
  BigNum::BigNum(&local_70,r1);
  BigNum::BigNum(&local_90,r2);
  bVar1 = operator>(&local_70,&local_90);
  pBVar2 = r2;
  if (bVar1) {
    pBVar2 = r1;
  }
  BigNum::BigNum(&local_50,pBVar2);
  BigNum::BigNum(&local_d0,r1);
  BigNum::BigNum(&local_f0,r2);
  bVar1 = operator<(&local_d0,&local_f0);
  pBVar2 = r2;
  if (bVar1) {
    pBVar2 = r1;
  }
  BigNum::BigNum(&local_b0,pBVar2);
  BigNum::BigNum(&local_110,1);
  BigNum::BigNum(&local_130,0);
  BigNum::BigNum(&local_150,0);
  BigNum::BigNum(&local_170,1);
  BigNum::BigNum(&local_190,r1);
  BigNum::BigNum(&local_1b0,r2);
  bVar1 = operator>(&local_190,&local_1b0);
  pBVar2 = b;
  if (bVar1) {
    pBVar2 = a;
  }
  BigNum::BigNum(&local_1d0,r1);
  BigNum::BigNum(&local_1f0,r2);
  bVar1 = operator<(&local_1d0,&local_1f0);
  if (bVar1) {
    b = a;
  }
  ex_al_eu_in(&local_50,&local_b0,&local_110,&local_130,&local_150,&local_170,gcd,pBVar2,b);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_1f0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_1d0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_1b0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_190);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_170);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_150);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_130);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_110);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_b0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_f0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_d0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_70);
  return;
}

Assistant:

void ex_al_eu(BigNum r1, BigNum r2, BigNum &gcd, BigNum &a, BigNum &b) {
    ex_al_eu_in(r1 > r2 ? r1 : r2, r1 < r2 ? r1 : r2, BigNum(1), BigNum(0), BigNum(0), BigNum(1), gcd, r1 > r2 ? a : b, r1 < r2 ? a : b);
}